

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void check_mkstemp_result(uv_fs_t *req)

{
  int iVar1;
  __uid_t _Var2;
  size_t sVar3;
  uv_loop_t *puVar4;
  int **ppiVar5;
  undefined8 uVar6;
  uv_loop_t *puVar7;
  void *pvVar8;
  uv_fs_t *unaff_RBX;
  char *pcVar9;
  int **ppiVar10;
  int **ppiVar11;
  undefined8 *puVar12;
  uv_loop_t *puVar13;
  char *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  int **unaff_R14;
  int **ppiVar17;
  int **ppiVar18;
  int **ppiVar19;
  uv_buf_t uVar20;
  undefined1 auStack_f68 [88];
  long lStack_f10;
  long lStack_f08;
  code *pcStack_db0;
  code *pcStack_da8;
  undefined8 uStack_da0;
  char acStack_d90 [88];
  char *pcStack_d38;
  uv_loop_t *puStack_bd8;
  int **ppiStack_bd0;
  code *pcStack_bc8;
  code *pcStack_bc0;
  uv_loop_t *puStack_bb8;
  code *pcStack_bb0;
  int *apiStack_ba8 [11];
  uv_loop_t *puStack_b50;
  int **ppiStack_9f0;
  int **ppiStack_9e8;
  undefined8 uStack_9e0;
  int *apiStack_9d0 [11];
  int **ppiStack_978;
  undefined8 *puStack_818;
  int **ppiStack_810;
  code *pcStack_808;
  code *pcStack_800;
  undefined1 auStack_7f0 [88];
  long lStack_798;
  uint uStack_778;
  code *pcStack_638;
  undefined8 uStack_630;
  int *apiStack_628 [11];
  char *pcStack_5d0;
  char *pcStack_470;
  int **ppiStack_468;
  int *apiStack_450 [11];
  char *pcStack_3f8;
  char *pcStack_298;
  int **ppiStack_290;
  code *pcStack_288;
  undefined8 uStack_280;
  stat64 sStack_270;
  int *apiStack_1e0 [11];
  char *pcStack_188;
  int **ppiStack_180;
  undefined1 auStack_170 [328];
  uv_fs_t *puStack_28;
  int **ppiStack_20;
  
  if (req->fs_type == UV_FS_MKSTEMP) {
    unaff_RBX = req;
    if (req->result < 0) goto LAB_00154856;
    unaff_R14 = (int **)req->path;
    if (unaff_R14 == (int **)0x0) goto LAB_0015485b;
    ppiStack_20 = (int **)0x1547d0;
    sVar3 = strlen((char *)unaff_R14);
    if (sVar3 != 0x10) goto LAB_00154860;
    if (*(short *)(unaff_R14 + 1) != 0x5f65 || *unaff_R14 != (int *)0x6c69665f74736574)
    goto LAB_00154865;
    if (*(short *)((long)unaff_R14 + 0xe) == 0x5858 && *(int *)((long)unaff_R14 + 10) == 0x58585858)
    goto LAB_0015486a;
    ppiStack_20 = (int **)0x15481d;
    check_permission((char *)unaff_R14,0x180);
    ppiStack_20 = (int **)0x154831;
    iVar1 = uv_fs_stat(0,&stat_req,req->path,0);
    if (iVar1 != 0) goto LAB_0015486f;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    ppiStack_20 = (int **)0x154856;
    check_mkstemp_result_cold_1();
LAB_00154856:
    ppiStack_20 = (int **)0x15485b;
    check_mkstemp_result_cold_2();
LAB_0015485b:
    ppiStack_20 = (int **)0x154860;
    check_mkstemp_result_cold_8();
LAB_00154860:
    ppiStack_20 = (int **)0x154865;
    check_mkstemp_result_cold_3();
LAB_00154865:
    ppiStack_20 = (int **)0x15486a;
    check_mkstemp_result_cold_4();
LAB_0015486a:
    ppiStack_20 = (int **)0x15486f;
    check_mkstemp_result_cold_7();
LAB_0015486f:
    ppiStack_20 = (int **)0x154874;
    check_mkstemp_result_cold_5();
  }
  ppiStack_20 = (int **)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  pcVar9 = "test_file";
  pcStack_288 = (code *)0x154892;
  puStack_28 = unaff_RBX;
  ppiStack_20 = unaff_R14;
  unlink("test_file");
  pcStack_288 = (code *)0x154897;
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  pcStack_288 = (code *)0x1548be;
  iVar1 = uv_fs_open(0,apiStack_1e0,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_188;
  if (iVar1 < 0) {
    pcStack_288 = (code *)0x154c23;
    run_test_fs_fstat_cold_1();
LAB_00154c23:
    pcStack_288 = (code *)0x154c28;
    run_test_fs_fstat_cold_2();
LAB_00154c28:
    pcStack_288 = (code *)0x154c2d;
    run_test_fs_fstat_cold_3();
LAB_00154c2d:
    pcStack_288 = (code *)0x154c32;
    run_test_fs_fstat_cold_4();
LAB_00154c32:
    pcStack_288 = (code *)0x154c37;
    run_test_fs_fstat_cold_5();
LAB_00154c37:
    pcStack_288 = (code *)0x154c3c;
    run_test_fs_fstat_cold_6();
LAB_00154c3c:
    pcStack_288 = (code *)0x154c41;
    run_test_fs_fstat_cold_7();
LAB_00154c41:
    pcStack_288 = (code *)0x154c46;
    run_test_fs_fstat_cold_8();
LAB_00154c46:
    pcStack_288 = (code *)0x154c4b;
    run_test_fs_fstat_cold_9();
LAB_00154c4b:
    pcStack_288 = (code *)0x154c50;
    run_test_fs_fstat_cold_10();
LAB_00154c50:
    pcStack_288 = (code *)0x154c55;
    run_test_fs_fstat_cold_11();
LAB_00154c55:
    pcStack_288 = (code *)0x154c5a;
    run_test_fs_fstat_cold_12();
LAB_00154c5a:
    pcStack_288 = (code *)0x154c5f;
    run_test_fs_fstat_cold_13();
LAB_00154c5f:
    pcStack_288 = (code *)0x154c64;
    run_test_fs_fstat_cold_14();
LAB_00154c64:
    pcStack_288 = (code *)0x154c69;
    run_test_fs_fstat_cold_15();
LAB_00154c69:
    pcStack_288 = (code *)0x154c6e;
    run_test_fs_fstat_cold_16();
LAB_00154c6e:
    pcStack_288 = (code *)0x154c73;
    run_test_fs_fstat_cold_17();
LAB_00154c73:
    pcStack_288 = (code *)0x154c78;
    run_test_fs_fstat_cold_18();
LAB_00154c78:
    pcStack_288 = (code *)0x154c7d;
    run_test_fs_fstat_cold_19();
LAB_00154c7d:
    pcStack_288 = (code *)0x154c82;
    run_test_fs_fstat_cold_20();
LAB_00154c82:
    pcStack_288 = (code *)0x154c87;
    run_test_fs_fstat_cold_21();
LAB_00154c87:
    pcStack_288 = (code *)0x154c8c;
    run_test_fs_fstat_cold_22();
LAB_00154c8c:
    pcStack_288 = (code *)0x154c91;
    run_test_fs_fstat_cold_23();
LAB_00154c91:
    pcStack_288 = (code *)0x154c96;
    run_test_fs_fstat_cold_24();
LAB_00154c96:
    pcStack_288 = (code *)0x154c9b;
    run_test_fs_fstat_cold_25();
LAB_00154c9b:
    pcStack_288 = (code *)0x154ca0;
    run_test_fs_fstat_cold_26();
LAB_00154ca0:
    pcStack_288 = (code *)0x154ca5;
    run_test_fs_fstat_cold_27();
LAB_00154ca5:
    pcStack_288 = (code *)0x154caa;
    run_test_fs_fstat_cold_28();
LAB_00154caa:
    pcStack_288 = (code *)0x154caf;
    run_test_fs_fstat_cold_29();
LAB_00154caf:
    pcStack_288 = (code *)0x154cb4;
    run_test_fs_fstat_cold_30();
LAB_00154cb4:
    pcStack_288 = (code *)0x154cb9;
    run_test_fs_fstat_cold_31();
LAB_00154cb9:
    pcStack_288 = (code *)0x154cbe;
    run_test_fs_fstat_cold_32();
LAB_00154cbe:
    pcStack_288 = (code *)0x154cc3;
    run_test_fs_fstat_cold_33();
LAB_00154cc3:
    pcStack_288 = (code *)0x154cc8;
    run_test_fs_fstat_cold_34();
LAB_00154cc8:
    pcStack_288 = (code *)0x154ccd;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar9 = pcStack_188;
    if ((long)pcStack_188 < 0) goto LAB_00154c23;
    pcStack_288 = (code *)0x1548e4;
    uv_fs_req_cleanup(apiStack_1e0);
    puVar4 = (uv_loop_t *)((ulong)pcVar14 & 0xffffffff);
    pcStack_288 = (code *)0x1548f0;
    iVar1 = fstat64((int)pcVar14,&sStack_270);
    pcVar9 = pcVar14;
    if (iVar1 != 0) goto LAB_00154c28;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x15490b;
    iVar1 = uv_fs_fstat(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154c2d;
    if (pcStack_188 != (char *)0x0) goto LAB_00154c32;
    if ((ppiStack_180[0x12] != (int *)0x0) &&
       (ppiStack_180[0x12] != (int *)sStack_270.st_ctim.tv_sec)) goto LAB_00154c37;
    if ((ppiStack_180[0x13] != (int *)0x0) &&
       (ppiStack_180[0x13] != (int *)sStack_270.st_ctim.tv_nsec)) goto LAB_00154c3c;
    pcStack_288 = (code *)0x15496c;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_280 = 0;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x1549a7;
    iVar1 = uv_fs_write(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0xd) goto LAB_00154c41;
    if (pcStack_188 != (char *)0xd) goto LAB_00154c46;
    unaff_R14 = apiStack_1e0;
    pcStack_288 = (code *)0x1549cf;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_288 = (code *)0x1549e6;
    memset(auStack_170,0xaa,0xa0);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x1549f4;
    iVar1 = uv_fs_fstat(0,unaff_R14,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154c4b;
    if (pcStack_188 != (char *)0x0) goto LAB_00154c50;
    unaff_R14 = ppiStack_180;
    if (ppiStack_180[7] != (int *)0xd) goto LAB_00154c55;
    puVar4 = (uv_loop_t *)((ulong)pcVar14 & 0xffffffff);
    pcStack_288 = (code *)0x154a2a;
    iVar1 = fstat64((int)pcVar14,&sStack_270);
    if (iVar1 != 0) goto LAB_00154c5a;
    if (*ppiStack_180 != (int *)sStack_270.st_dev) goto LAB_00154c5f;
    if (ppiStack_180[1] != (int *)(ulong)sStack_270.st_mode) goto LAB_00154c64;
    if (ppiStack_180[2] != (int *)sStack_270.st_nlink) goto LAB_00154c69;
    if (ppiStack_180[3] != (int *)(ulong)sStack_270.st_uid) goto LAB_00154c6e;
    if (ppiStack_180[4] != (int *)(ulong)sStack_270.st_gid) goto LAB_00154c73;
    if (ppiStack_180[5] != (int *)sStack_270.st_rdev) goto LAB_00154c78;
    if (ppiStack_180[6] != (int *)sStack_270.st_ino) goto LAB_00154c7d;
    if (ppiStack_180[7] != (int *)sStack_270.st_size) goto LAB_00154c82;
    if (ppiStack_180[8] != (int *)sStack_270.st_blksize) goto LAB_00154c87;
    if (ppiStack_180[9] != (int *)sStack_270.st_blocks) goto LAB_00154c8c;
    if (ppiStack_180[0xc] != (int *)sStack_270.st_atim.tv_sec) goto LAB_00154c91;
    if (ppiStack_180[0xd] != (int *)sStack_270.st_atim.tv_nsec) goto LAB_00154c96;
    if (ppiStack_180[0xe] != (int *)sStack_270.st_mtim.tv_sec) goto LAB_00154c9b;
    if (ppiStack_180[0xf] != (int *)sStack_270.st_mtim.tv_nsec) goto LAB_00154ca0;
    if (ppiStack_180[0x10] != (int *)sStack_270.st_ctim.tv_sec) goto LAB_00154ca5;
    if (ppiStack_180[0x11] != (int *)sStack_270.st_ctim.tv_nsec) goto LAB_00154caa;
    if (ppiStack_180[10] != (int *)0x0) goto LAB_00154caf;
    if (ppiStack_180[0xb] != (int *)0x0) goto LAB_00154cb4;
    unaff_R14 = apiStack_1e0;
    pcStack_288 = (code *)0x154b4d;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_288 = (code *)0x154b65;
    puVar4 = loop;
    iVar1 = uv_fs_fstat(loop,unaff_R14,(ulong)pcVar14 & 0xffffffff,fstat_cb);
    if (iVar1 != 0) goto LAB_00154cb9;
    pcStack_288 = (code *)0x154b7b;
    puVar4 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154cbe;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x154b9b;
    iVar1 = uv_fs_close(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154cc3;
    if (pcStack_188 != (char *)0x0) goto LAB_00154cc8;
    pcStack_288 = (code *)0x154bbf;
    uv_fs_req_cleanup(apiStack_1e0);
    pcStack_288 = (code *)0x154bcd;
    uv_run(loop,0);
    pcStack_288 = (code *)0x154bd9;
    unlink("test_file");
    pcStack_288 = (code *)0x154bde;
    pcVar9 = (char *)uv_default_loop();
    pcStack_288 = (code *)0x154bf2;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_288 = (code *)0x154bfc;
    uv_run(pcVar9,0);
    pcStack_288 = (code *)0x154c01;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_288 = (code *)0x154c09;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_288 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar4->backend_fd == 8) {
    if (puVar4->watcher_queue[0] != (void *)0x0) goto LAB_00154cfd;
    if (*(long *)((long)puVar4->watcher_queue[1] + 0x38) == 0xd) {
      ppiStack_290 = (int **)0x154cf0;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return;
    }
  }
  else {
    ppiStack_290 = (int **)0x154cfd;
    fstat_cb_cold_1();
LAB_00154cfd:
    ppiStack_290 = (int **)0x154d02;
    fstat_cb_cold_2();
  }
  ppiStack_290 = (int **)run_test_fs_access;
  fstat_cb_cold_3();
  ppiVar17 = apiStack_450;
  ppiVar5 = apiStack_450;
  ppiVar10 = (int **)0x184385;
  pcStack_298 = pcVar9;
  ppiStack_290 = unaff_R14;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_access(0,apiStack_450,"test_file",0,0);
  if (iVar1 < 0) {
    if (-1 < (long)pcStack_3f8) goto LAB_00154f70;
    uv_fs_req_cleanup(apiStack_450);
    puVar4 = loop;
    iVar1 = uv_fs_access(loop,apiStack_450,"test_file",0,access_cb);
    ppiVar10 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154f75;
    puVar4 = loop;
    uv_run(loop,0);
    ppiVar10 = apiStack_450;
    if (access_cb_count != 1) goto LAB_00154f7a;
    access_cb_count = 0;
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,apiStack_450,"test_file",0x42,0x180,0);
    ppiVar11 = (int **)pcStack_3f8;
    ppiVar10 = apiStack_450;
    if (iVar1 < 0) goto LAB_00154f7f;
    if ((long)pcStack_3f8 < 0) goto LAB_00154f84;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_450,"test_file",0,0);
    unaff_R14 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154f89;
    unaff_R14 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154f8e;
    uv_fs_req_cleanup(apiStack_450);
    puVar4 = loop;
    iVar1 = uv_fs_access(loop,apiStack_450,"test_file",0,access_cb);
    if (iVar1 != 0) goto LAB_00154f93;
    puVar4 = loop;
    uv_run(loop,0);
    ppiVar17 = apiStack_450;
    if (access_cb_count != 1) goto LAB_00154f98;
    access_cb_count = 0;
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_close(0,apiStack_450,(ulong)ppiVar11 & 0xffffffff,0);
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154f9d;
    ppiVar17 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154fa2;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_mkdir(0,apiStack_450,"test_dir",0x1ff,0);
    ppiVar11 = apiStack_450;
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154fa7;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_450,"test_dir",2,0);
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154fac;
    ppiVar5 = apiStack_450;
    ppiVar17 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154fb1;
    uv_fs_req_cleanup(apiStack_450);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    ppiVar5 = (int **)uv_default_loop();
    uv_walk(ppiVar5,close_walk_cb,0);
    uv_run(ppiVar5,0);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    ppiVar17 = apiStack_450;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154f70:
    run_test_fs_access_cold_2();
LAB_00154f75:
    run_test_fs_access_cold_3();
LAB_00154f7a:
    run_test_fs_access_cold_4();
LAB_00154f7f:
    ppiVar11 = ppiVar10;
    run_test_fs_access_cold_5();
LAB_00154f84:
    run_test_fs_access_cold_6();
LAB_00154f89:
    run_test_fs_access_cold_7();
LAB_00154f8e:
    ppiVar17 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00154f93:
    run_test_fs_access_cold_9();
LAB_00154f98:
    run_test_fs_access_cold_10();
LAB_00154f9d:
    run_test_fs_access_cold_11();
LAB_00154fa2:
    run_test_fs_access_cold_12();
LAB_00154fa7:
    ppiVar5 = ppiVar11;
    run_test_fs_access_cold_13();
LAB_00154fac:
    run_test_fs_access_cold_14();
LAB_00154fb1:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar4->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup();
    return;
  }
  access_cb_cold_1();
  pcVar9 = "test_file";
  pcStack_638 = (code *)0x154fed;
  pcStack_470 = (char *)ppiVar5;
  ppiStack_468 = ppiVar17;
  unlink("test_file");
  pcStack_638 = (code *)0x154ff2;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar5 = apiStack_628;
  puVar4 = (uv_loop_t *)0x0;
  pcStack_638 = (code *)0x155016;
  iVar1 = uv_fs_open(0,ppiVar5,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_5d0;
  if (iVar1 < 0) {
    pcStack_638 = (code *)0x1552e9;
    run_test_fs_chmod_cold_1();
LAB_001552e9:
    pcStack_638 = (code *)0x1552ee;
    run_test_fs_chmod_cold_2();
LAB_001552ee:
    pcStack_638 = (code *)0x1552f3;
    run_test_fs_chmod_cold_3();
LAB_001552f3:
    pcStack_638 = (code *)0x1552f8;
    run_test_fs_chmod_cold_4();
LAB_001552f8:
    pcStack_638 = (code *)0x1552fd;
    run_test_fs_chmod_cold_5();
LAB_001552fd:
    pcStack_638 = (code *)0x155302;
    run_test_fs_chmod_cold_6();
LAB_00155302:
    pcStack_638 = (code *)0x155307;
    run_test_fs_chmod_cold_7();
LAB_00155307:
    pcStack_638 = (code *)0x15530c;
    run_test_fs_chmod_cold_8();
LAB_0015530c:
    pcStack_638 = (code *)0x155311;
    run_test_fs_chmod_cold_9();
LAB_00155311:
    pcStack_638 = (code *)0x155316;
    run_test_fs_chmod_cold_10();
LAB_00155316:
    pcStack_638 = (code *)0x15531b;
    run_test_fs_chmod_cold_11();
LAB_0015531b:
    pcStack_638 = (code *)0x155320;
    run_test_fs_chmod_cold_12();
LAB_00155320:
    pcStack_638 = (code *)0x155325;
    run_test_fs_chmod_cold_13();
LAB_00155325:
    pcStack_638 = (code *)0x15532a;
    run_test_fs_chmod_cold_14();
LAB_0015532a:
    pcStack_638 = (code *)0x15532f;
    run_test_fs_chmod_cold_15();
LAB_0015532f:
    pcStack_638 = (code *)0x155334;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar9 = pcStack_5d0;
    if ((long)pcStack_5d0 < 0) goto LAB_001552e9;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x155039;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x15504a;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_630 = 0;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x155080;
    ppiVar5 = ppiVar17;
    iov = uVar20;
    iVar1 = uv_fs_write(0,ppiVar17,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar14;
    if (iVar1 != 0xd) goto LAB_001552ee;
    if (pcStack_5d0 != (char *)0xd) goto LAB_001552f3;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x1550a2;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x1550bb;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001552f8;
    if (pcStack_5d0 != (char *)0x0) goto LAB_001552fd;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x1550dc;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x1550f0;
    check_permission("test_file",0x80);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x155105;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_00155302;
    if (pcStack_5d0 != (char *)0x0) goto LAB_00155307;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x155126;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x155137;
    check_permission("test_file",0x100);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x15514b;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_fchmod(0,ppiVar17,(ulong)pcVar14 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_0015530c;
    if (pcStack_5d0 != (char *)0x0) goto LAB_00155311;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x15516c;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x155180;
    check_permission("test_file",0x180);
    apiStack_628[0] = &run_test_fs_chmod::mode;
    pcStack_638 = (code *)0x1551a8;
    ppiVar5 = ppiVar17;
    puVar4 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar17,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_00155316;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x1551be;
    puVar4 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015531b;
    chmod_cb_count = 0;
    ppiVar5 = apiStack_628;
    apiStack_628[0] = &run_test_fs_chmod::mode_1;
    pcStack_638 = (code *)0x155203;
    puVar4 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar5,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155320;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x155219;
    puVar4 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155325;
    ppiVar5 = apiStack_628;
    apiStack_628[0] = &run_test_fs_chmod::mode_2;
    pcStack_638 = (code *)0x15524f;
    puVar4 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar5,(ulong)pcVar14 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015532a;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x155265;
    puVar4 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_0015532f;
    pcStack_638 = (code *)0x155287;
    uv_fs_close(loop,apiStack_628,(ulong)pcVar14 & 0xffffffff,0);
    pcStack_638 = (code *)0x155295;
    uv_run(loop,0);
    pcStack_638 = (code *)0x1552a1;
    unlink("test_file");
    pcStack_638 = (code *)0x1552a6;
    pcVar9 = (char *)uv_default_loop();
    pcStack_638 = (code *)0x1552ba;
    uv_walk(pcVar9,close_walk_cb,0);
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x1552c4;
    uv_run(pcVar9);
    pcStack_638 = (code *)0x1552c9;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_638 = (code *)0x1552d1;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_638 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar12 = (undefined8 *)((ulong)ppiVar5 & 0xffffffff);
  puVar15 = (undefined8 *)0x0;
  pcStack_800 = (code *)0x155354;
  pcStack_638 = (code *)pcVar9;
  iVar1 = uv_fs_stat(0,auStack_7f0,puVar4,0);
  if (iVar1 == 0) {
    if (lStack_798 != 0) goto LAB_00155388;
    if ((uStack_778 & 0x1ff) == (uint)ppiVar5) {
      pcStack_800 = (code *)0x15537a;
      uv_fs_req_cleanup(auStack_7f0);
      return;
    }
  }
  else {
    pcStack_800 = (code *)0x155388;
    check_permission_cold_1();
LAB_00155388:
    pcStack_800 = (code *)0x15538d;
    check_permission_cold_2();
  }
  pcStack_800 = chmod_cb;
  check_permission_cold_3();
  pcStack_800 = (code *)puVar12;
  if (*(int *)(puVar15 + 8) == 0xd) {
    puVar12 = puVar15;
    if (puVar15[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_808 = (code *)0x1553b1;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*(uint *)*puVar15);
      return;
    }
  }
  else {
    pcStack_808 = (code *)0x1553c8;
    chmod_cb_cold_1();
  }
  pcStack_808 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_808 = (code *)puVar12;
  if (*(int *)(puVar15 + 8) == 0xe) {
    puStack_818 = puVar15;
    if (puVar15[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_810 = (int **)0x1553ec;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*(uint *)*puVar15);
      return;
    }
  }
  else {
    ppiStack_810 = (int **)0x155403;
    fchmod_cb_cold_1();
    puStack_818 = puVar12;
  }
  ppiStack_810 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar5 = (int **)0x184385;
  ppiStack_9e8 = (int **)0x155421;
  ppiStack_810 = ppiVar17;
  unlink("test_file");
  ppiStack_9e8 = (int **)0x155426;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_9e8 = (int **)0x15544a;
  iVar1 = uv_fs_open(0,apiStack_9d0,"test_file",0x42,0x180,0);
  ppiVar10 = ppiStack_978;
  if (iVar1 < 0) {
    ppiStack_9e8 = (int **)0x1555e7;
    run_test_fs_unlink_readonly_cold_1();
LAB_001555e7:
    ppiStack_9e8 = (int **)0x1555ec;
    run_test_fs_unlink_readonly_cold_2();
LAB_001555ec:
    ppiStack_9e8 = (int **)0x1555f1;
    run_test_fs_unlink_readonly_cold_3();
LAB_001555f1:
    ppiStack_9e8 = (int **)0x1555f6;
    run_test_fs_unlink_readonly_cold_4();
LAB_001555f6:
    ppiStack_9e8 = (int **)0x1555fb;
    run_test_fs_unlink_readonly_cold_5();
LAB_001555fb:
    ppiStack_9e8 = (int **)0x155600;
    run_test_fs_unlink_readonly_cold_6();
LAB_00155600:
    ppiStack_9e8 = (int **)0x155605;
    run_test_fs_unlink_readonly_cold_7();
LAB_00155605:
    ppiStack_9e8 = (int **)0x15560a;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar5 = ppiStack_978;
    if ((long)ppiStack_978 < 0) goto LAB_001555e7;
    ppiVar17 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x15546d;
    uv_fs_req_cleanup(ppiVar17);
    ppiStack_9e8 = (int **)0x15547e;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_9e0 = 0;
    ppiStack_9e8 = (int **)0x1554b4;
    iov = uVar20;
    iVar1 = uv_fs_write(0,ppiVar17,(ulong)ppiVar10 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar5 = ppiVar10;
    if (iVar1 != 0xd) goto LAB_001555ec;
    if (ppiStack_978 != (int **)0xd) goto LAB_001555f1;
    ppiVar17 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x1554d6;
    uv_fs_req_cleanup(ppiVar17);
    ppiStack_9e8 = (int **)0x1554e9;
    uv_fs_close(loop,ppiVar17,(ulong)ppiVar10 & 0xffffffff,0);
    ppiStack_9e8 = (int **)0x155502;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001555f6;
    if (ppiStack_978 != (int **)0x0) goto LAB_001555fb;
    ppiVar5 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x155523;
    uv_fs_req_cleanup(ppiVar5);
    ppiVar17 = (int **)0x184385;
    ppiStack_9e8 = (int **)0x155537;
    check_permission("test_file",0x100);
    ppiStack_9e8 = (int **)0x155546;
    iVar1 = uv_fs_unlink(0,ppiVar5,"test_file",0);
    if (iVar1 != 0) goto LAB_00155600;
    if (ppiStack_978 != (int **)0x0) goto LAB_00155605;
    ppiStack_9e8 = (int **)0x155567;
    uv_fs_req_cleanup(apiStack_9d0);
    ppiStack_9e8 = (int **)0x155575;
    uv_run(loop,0);
    ppiVar17 = (int **)0x184385;
    ppiStack_9e8 = (int **)0x155591;
    uv_fs_chmod(0,apiStack_9d0,"test_file",0x180,0);
    ppiStack_9e8 = (int **)0x155599;
    uv_fs_req_cleanup(apiStack_9d0);
    ppiStack_9e8 = (int **)0x1555a1;
    unlink("test_file");
    ppiStack_9e8 = (int **)0x1555a6;
    ppiVar5 = (int **)uv_default_loop();
    ppiStack_9e8 = (int **)0x1555ba;
    uv_walk(ppiVar5,close_walk_cb,0);
    ppiStack_9e8 = (int **)0x1555c4;
    uv_run(ppiVar5,0);
    ppiStack_9e8 = (int **)0x1555c9;
    uVar6 = uv_default_loop();
    ppiStack_9e8 = (int **)0x1555d1;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      return;
    }
  }
  ppiStack_9e8 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar18 = apiStack_ba8;
  ppiVar19 = apiStack_ba8;
  ppiVar11 = apiStack_ba8;
  ppiVar10 = apiStack_ba8;
  puVar13 = (uv_loop_t *)0x184385;
  pcStack_bb0 = (code *)0x155628;
  ppiStack_9f0 = ppiVar5;
  ppiStack_9e8 = ppiVar17;
  unlink("test_file");
  pcStack_bb0 = (code *)0x155634;
  unlink("test_file_link");
  pcStack_bb0 = (code *)0x155639;
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  pcStack_bb0 = (code *)0x15565b;
  iVar1 = uv_fs_open(0,apiStack_ba8,"test_file",0x42,0x180,0);
  puVar4 = puStack_b50;
  if (iVar1 < 0) {
    pcStack_bb0 = (code *)0x15592c;
    run_test_fs_chown_cold_1();
LAB_0015592c:
    pcStack_bb0 = (code *)0x155931;
    run_test_fs_chown_cold_2();
LAB_00155931:
    pcStack_bb0 = (code *)0x155936;
    run_test_fs_chown_cold_3();
LAB_00155936:
    ppiVar18 = ppiVar17;
    pcStack_bb0 = (code *)0x15593b;
    run_test_fs_chown_cold_4();
LAB_0015593b:
    pcStack_bb0 = (code *)0x155940;
    run_test_fs_chown_cold_5();
LAB_00155940:
    ppiVar19 = ppiVar18;
    pcStack_bb0 = (code *)0x155945;
    run_test_fs_chown_cold_6();
LAB_00155945:
    pcStack_bb0 = (code *)0x15594a;
    run_test_fs_chown_cold_7();
LAB_0015594a:
    pcStack_bb0 = (code *)0x15594f;
    run_test_fs_chown_cold_8();
LAB_0015594f:
    pcStack_bb0 = (code *)0x155954;
    run_test_fs_chown_cold_9();
LAB_00155954:
    pcStack_bb0 = (code *)0x155959;
    run_test_fs_chown_cold_10();
LAB_00155959:
    pcStack_bb0 = (code *)0x15595e;
    run_test_fs_chown_cold_11();
LAB_0015595e:
    pcStack_bb0 = (code *)0x155963;
    run_test_fs_chown_cold_12();
LAB_00155963:
    pcStack_bb0 = (code *)0x155968;
    run_test_fs_chown_cold_13();
LAB_00155968:
    ppiVar11 = ppiVar19;
    pcStack_bb0 = (code *)0x15596d;
    run_test_fs_chown_cold_14();
LAB_0015596d:
    pcStack_bb0 = (code *)0x155972;
    run_test_fs_chown_cold_15();
LAB_00155972:
    ppiVar10 = ppiVar11;
    pcStack_bb0 = (code *)0x155977;
    run_test_fs_chown_cold_16();
LAB_00155977:
    pcStack_bb0 = (code *)0x15597c;
    run_test_fs_chown_cold_17();
LAB_0015597c:
    pcStack_bb0 = (code *)0x155981;
    run_test_fs_chown_cold_18();
LAB_00155981:
    pcStack_bb0 = (code *)0x155986;
    run_test_fs_chown_cold_19();
LAB_00155986:
    pcStack_bb0 = (code *)0x15598b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar13 = puStack_b50;
    if ((long)puStack_b50 < 0) goto LAB_0015592c;
    pcStack_bb0 = (code *)0x15567c;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x15569b;
    iVar1 = uv_fs_chown(0,apiStack_ba8,"test_file",0xffffffff,0xffffffff,0);
    puVar13 = puVar4;
    ppiVar17 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155931;
    ppiVar17 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155936;
    pcStack_bb0 = (code *)0x1556ba;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x1556d4;
    iVar1 = uv_fs_fchown(0,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015593b;
    ppiVar18 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155940;
    pcStack_bb0 = (code *)0x1556f3;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x15571b;
    puVar7 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_ba8,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155945;
    pcStack_bb0 = (code *)0x155731;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (chown_cb_count != 1) goto LAB_0015594a;
    chown_cb_count = 0;
    pcStack_bb0 = (code *)0x15576a;
    puVar7 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_ba8,"test_file",0,0,chown_root_cb);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_0015594f;
    pcStack_bb0 = (code *)0x155780;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (chown_cb_count != 1) goto LAB_00155954;
    pcStack_bb0 = (code *)0x1557b0;
    puVar7 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155959;
    pcStack_bb0 = (code *)0x1557c6;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (fchown_cb_count != 1) goto LAB_0015595e;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x1557ee;
    iVar1 = uv_fs_link(0,apiStack_ba8,"test_file","test_file_link",0);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155963;
    ppiVar19 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155968;
    pcStack_bb0 = (code *)0x15580d;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x15582c;
    iVar1 = uv_fs_lchown(0,apiStack_ba8,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015596d;
    ppiVar11 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155972;
    pcStack_bb0 = (code *)0x15584b;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x155873;
    puVar7 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_ba8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_00155977;
    pcStack_bb0 = (code *)0x155889;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar10 = apiStack_ba8;
    if (lchown_cb_count != 1) goto LAB_0015597c;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x1558a4;
    iVar1 = uv_fs_close(0,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0);
    ppiVar10 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155981;
    ppiVar10 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155986;
    pcStack_bb0 = (code *)0x1558c0;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x1558ce;
    uv_run(loop,0);
    pcStack_bb0 = (code *)0x1558da;
    unlink("test_file");
    pcStack_bb0 = (code *)0x1558e6;
    unlink("test_file_link");
    pcStack_bb0 = (code *)0x1558eb;
    puVar13 = (uv_loop_t *)uv_default_loop();
    pcStack_bb0 = (code *)0x1558ff;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_bb0 = (code *)0x155909;
    uv_run(puVar13,0);
    pcStack_bb0 = (code *)0x15590e;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_bb0 = (code *)0x155916;
    iVar1 = uv_loop_close();
    ppiVar10 = apiStack_ba8;
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_bb0 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar7->backend_fd == 0x1a) {
    if (puVar7->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_bb8 = (uv_loop_t *)0x1559af;
    chown_cb_cold_1();
  }
  puStack_bb8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_bb8 = puVar13;
  if (puVar7->backend_fd == 0x1a) {
    pcStack_bc0 = (code *)0x1559c3;
    puVar4 = puVar7;
    _Var2 = geteuid();
    pvVar8 = puVar7->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar8 == (void *)0xffffffffffffffff) goto LAB_001559db;
      pcStack_bc0 = (code *)0x1559d6;
      chown_root_cb_cold_2();
    }
    puVar13 = puVar7;
    if (pvVar8 == (void *)0x0) {
LAB_001559db:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar7);
      return;
    }
  }
  else {
    pcStack_bc0 = (code *)0x1559ef;
    chown_root_cb_cold_1();
    puVar4 = puVar7;
  }
  pcStack_bc0 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar4->backend_fd == 0x1b) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_bc8 = (code *)0x155a13;
    fchown_cb_cold_1();
  }
  pcStack_bc8 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar4->backend_fd == 0x1e) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    ppiStack_bd0 = (int **)0x155a37;
    lchown_cb_cold_1();
  }
  ppiStack_bd0 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar9 = "test_file";
  pcStack_da8 = (code *)0x155a55;
  puStack_bd8 = puVar13;
  ppiStack_bd0 = ppiVar10;
  unlink("test_file");
  pcStack_da8 = (code *)0x155a61;
  unlink("test_file_link");
  pcStack_da8 = (code *)0x155a6d;
  unlink("test_file_link2");
  pcStack_da8 = (code *)0x155a72;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar16 = (char *)0x0;
  pcStack_da8 = (code *)0x155a96;
  iVar1 = uv_fs_open(0,acStack_d90,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_d38;
  if (iVar1 < 0) {
    pcStack_da8 = (code *)0x155dd4;
    run_test_fs_link_cold_1();
LAB_00155dd4:
    pcStack_da8 = (code *)0x155dd9;
    run_test_fs_link_cold_2();
LAB_00155dd9:
    pcStack_da8 = (code *)0x155dde;
    run_test_fs_link_cold_3();
LAB_00155dde:
    pcStack_da8 = (code *)0x155de3;
    run_test_fs_link_cold_4();
LAB_00155de3:
    pcStack_da8 = (code *)0x155de8;
    run_test_fs_link_cold_5();
LAB_00155de8:
    pcStack_da8 = (code *)0x155ded;
    run_test_fs_link_cold_6();
LAB_00155ded:
    pcVar14 = pcVar9;
    pcStack_da8 = (code *)0x155df2;
    run_test_fs_link_cold_7();
LAB_00155df2:
    pcStack_da8 = (code *)0x155df7;
    run_test_fs_link_cold_8();
LAB_00155df7:
    pcStack_da8 = (code *)0x155dfc;
    run_test_fs_link_cold_9();
LAB_00155dfc:
    pcStack_da8 = (code *)0x155e01;
    run_test_fs_link_cold_10();
LAB_00155e01:
    pcStack_da8 = (code *)0x155e06;
    run_test_fs_link_cold_11();
LAB_00155e06:
    pcStack_da8 = (code *)0x155e0b;
    run_test_fs_link_cold_12();
LAB_00155e0b:
    pcStack_da8 = (code *)0x155e10;
    run_test_fs_link_cold_13();
LAB_00155e10:
    pcVar9 = pcVar14;
    pcStack_da8 = (code *)0x155e15;
    run_test_fs_link_cold_14();
LAB_00155e15:
    pcStack_da8 = (code *)0x155e1a;
    run_test_fs_link_cold_15();
LAB_00155e1a:
    pcStack_da8 = (code *)0x155e1f;
    run_test_fs_link_cold_16();
LAB_00155e1f:
    pcStack_da8 = (code *)0x155e24;
    run_test_fs_link_cold_17();
LAB_00155e24:
    pcStack_da8 = (code *)0x155e29;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar9 = pcStack_d38;
    if ((long)pcStack_d38 < 0) goto LAB_00155dd4;
    pcStack_da8 = (code *)0x155ab9;
    uv_fs_req_cleanup(acStack_d90);
    pcStack_da8 = (code *)0x155aca;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155b00;
    iov = uVar20;
    iVar1 = uv_fs_write(0,acStack_d90,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar14;
    if (iVar1 != 0xd) goto LAB_00155dd9;
    if (pcStack_d38 != (char *)0xd) goto LAB_00155dde;
    pcStack_da8 = (code *)0x155b22;
    uv_fs_req_cleanup(acStack_d90);
    pcStack_da8 = (code *)0x155b35;
    uv_fs_close(loop,acStack_d90,(ulong)pcVar14 & 0xffffffff,0);
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155b50;
    iVar1 = uv_fs_link(0,acStack_d90,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155de3;
    if (pcStack_d38 != (char *)0x0) goto LAB_00155de8;
    pcStack_da8 = (code *)0x155b71;
    uv_fs_req_cleanup();
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155b8d;
    iVar1 = uv_fs_open(0,acStack_d90,"test_file_link",2,0,0);
    pcVar14 = pcStack_d38;
    pcVar9 = acStack_d90;
    if (iVar1 < 0) goto LAB_00155ded;
    if ((long)pcStack_d38 < 0) goto LAB_00155df2;
    pcStack_da8 = (code *)0x155bb0;
    uv_fs_req_cleanup(acStack_d90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_da8 = (code *)0x155bd2;
    uVar20 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155c04;
    iov = uVar20;
    iVar1 = uv_fs_read(0,acStack_d90,(ulong)pcVar14 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155df7;
    if ((long)pcStack_d38 < 0) goto LAB_00155dfc;
    pcVar16 = buf;
    pcStack_da8 = (code *)0x155c2b;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e01;
    pcStack_da8 = (code *)0x155c3a;
    close((int)pcVar14);
    pcStack_da8 = (code *)0x155c60;
    pcVar16 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_d90,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155e06;
    pcStack_da8 = (code *)0x155c76;
    pcVar16 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155e0b;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155ca1;
    iVar1 = uv_fs_open(0,acStack_d90,"test_file_link2",2,0,0);
    pcVar9 = pcStack_d38;
    if (iVar1 < 0) goto LAB_00155e10;
    if ((long)pcStack_d38 < 0) goto LAB_00155e15;
    pcStack_da8 = (code *)0x155cc4;
    uv_fs_req_cleanup(acStack_d90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_da8 = (code *)0x155ce6;
    uVar20 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155d18;
    iov = uVar20;
    iVar1 = uv_fs_read(0,acStack_d90,(ulong)pcVar9 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155e1a;
    if ((long)pcStack_d38 < 0) goto LAB_00155e1f;
    pcVar16 = buf;
    pcStack_da8 = (code *)0x155d3f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e24;
    pcStack_da8 = (code *)0x155d5c;
    uv_fs_close(loop,acStack_d90,(ulong)pcVar9 & 0xffffffff,0);
    pcStack_da8 = (code *)0x155d6a;
    uv_run(loop,0);
    pcStack_da8 = (code *)0x155d76;
    unlink("test_file");
    pcStack_da8 = (code *)0x155d82;
    unlink("test_file_link");
    pcStack_da8 = (code *)0x155d8e;
    unlink("test_file_link2");
    pcStack_da8 = (code *)0x155d93;
    pcVar9 = (char *)uv_default_loop();
    pcStack_da8 = (code *)0x155da7;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_da8 = (code *)0x155db1;
    uv_run(pcVar9,0);
    pcStack_da8 = (code *)0x155db6;
    pcVar16 = (char *)uv_default_loop();
    pcStack_da8 = (code *)0x155dbe;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_da8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar16)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar16)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_db0 = (code *)0x155e4d;
    link_cb_cold_1();
  }
  pcStack_db0 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_db0 = (code *)pcVar9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_f68,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155f47;
    if (dummy_cb_count != 1) goto LAB_00155f4c;
    if (lStack_f08 != 0) goto LAB_00155f51;
    if (lStack_f10 != -2) goto LAB_00155f56;
    uv_fs_req_cleanup(auStack_f68);
    iVar1 = uv_fs_readlink(0,auStack_f68,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155f5b;
    if (lStack_f08 != 0) goto LAB_00155f60;
    if (lStack_f10 == -2) {
      uv_fs_req_cleanup(auStack_f68);
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      uVar6 = uv_default_loop();
      iVar1 = uv_loop_close(uVar6);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00155f6a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155f47:
    run_test_fs_readlink_cold_2();
LAB_00155f4c:
    run_test_fs_readlink_cold_3();
LAB_00155f51:
    run_test_fs_readlink_cold_4();
LAB_00155f56:
    run_test_fs_readlink_cold_5();
LAB_00155f5b:
    run_test_fs_readlink_cold_6();
LAB_00155f60:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155f6a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void check_mkstemp_result(uv_fs_t* req) {
  int r;

  ASSERT(req->fs_type == UV_FS_MKSTEMP);
  ASSERT(req->result >= 0);
  ASSERT(req->path);
  ASSERT(strlen(req->path) == 16);
  ASSERT(memcmp(req->path, "test_file_", 10) == 0);
  ASSERT(memcmp(req->path + 10, "XXXXXX", 6) != 0);
  check_permission(req->path, 0600);

  /* Check if req->path is actually a file */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_mode & S_IFREG);
  uv_fs_req_cleanup(&stat_req);
}